

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

string * __thiscall helics::ActionMessage::getString_abi_cxx11_(ActionMessage *this,int index)

{
  pointer pbVar1;
  undefined1 *puVar2;
  
  puVar2 = emptyStr_abi_cxx11_;
  if ((-1 < index) &&
     (pbVar1 = (this->stringData).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     index < (int)((ulong)((long)(this->stringData).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) >> 5)))
  {
    puVar2 = (undefined1 *)(pbVar1 + (uint)index);
  }
  return (string *)puVar2;
}

Assistant:

const std::string& ActionMessage::getString(int index) const
{
    if (isValidIndex(index, stringData)) {
        return stringData[index];
    }
    return emptyStr;
}